

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O0

void __thiscall OPLio::OPLwriteInstrument(OPLio *this,uint channel,OPL2instrument *instr)

{
  OPL2instrument *instr_local;
  uint channel_local;
  OPLio *this_local;
  
  OPLwriteChannel(this,0x40,channel,'?','?');
  OPLwriteChannel(this,0x20,channel,instr->trem_vibr_1,instr->trem_vibr_2);
  OPLwriteChannel(this,0x60,channel,instr->att_dec_1,instr->att_dec_2);
  OPLwriteChannel(this,0x80,channel,instr->sust_rel_1,instr->sust_rel_2);
  OPLwriteChannel(this,0xe0,channel,instr->wave_1,instr->wave_2);
  OPLwriteValue(this,0xc0,channel,instr->feedback | 0x30);
  return;
}

Assistant:

void OPLio::OPLwriteInstrument(uint channel, struct OPL2instrument *instr)
{
	OPLwriteChannel(0x40, channel, 0x3F, 0x3F);		// no volume
	OPLwriteChannel(0x20, channel, instr->trem_vibr_1, instr->trem_vibr_2);
	OPLwriteChannel(0x60, channel, instr->att_dec_1,   instr->att_dec_2);
	OPLwriteChannel(0x80, channel, instr->sust_rel_1,  instr->sust_rel_2);
	OPLwriteChannel(0xE0, channel, instr->wave_1,      instr->wave_2);
	OPLwriteValue  (0xC0, channel, instr->feedback | 0x30);
}